

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_reset(sqlite3_stmt *pStmt)

{
  int rc_00;
  Vdbe *v;
  int rc;
  sqlite3_stmt *pStmt_local;
  
  if (pStmt == (sqlite3_stmt *)0x0) {
    v._4_4_ = 0;
  }
  else {
    sqlite3_mutex_enter(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
    rc_00 = sqlite3VdbeReset((Vdbe *)pStmt);
    sqlite3VdbeRewind((Vdbe *)pStmt);
    v._4_4_ = sqlite3ApiExit(*(sqlite3 **)pStmt,rc_00);
    sqlite3_mutex_leave(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
  }
  return v._4_4_;
}

Assistant:

SQLITE_API int sqlite3_reset(sqlite3_stmt *pStmt){
  int rc;
  if( pStmt==0 ){
    rc = SQLITE_OK;
  }else{
    Vdbe *v = (Vdbe*)pStmt;
    sqlite3_mutex_enter(v->db->mutex);
    rc = sqlite3VdbeReset(v);
    sqlite3VdbeRewind(v);
    assert( (rc & (v->db->errMask))==rc );
    rc = sqlite3ApiExit(v->db, rc);
    sqlite3_mutex_leave(v->db->mutex);
  }
  return rc;
}